

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd_test.cc
# Opt level: O1

void __thiscall RIPEMDTest_RunTest_Test::TestBody(RIPEMDTest_RunTest_Test *this)

{
  size_t n;
  long lVar1;
  uchar *puVar2;
  char *pcVar3;
  ulong len;
  ulong uVar4;
  ScopedTrace gtest_trace_61;
  ScopedTrace gtest_trace_65;
  uint8_t digest_1 [20];
  uint8_t digest [20];
  ScopedTrace local_f2;
  ScopedTrace local_f1;
  Bytes local_f0;
  unsigned_long local_e0;
  Bytes local_d8;
  internal local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0 [3];
  long local_a8;
  uint8_t *local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  
  lVar1 = 0;
  do {
    local_a0 = kRIPEMDTestCases[0].expected + lVar1;
    puVar2 = *(uchar **)(kRIPEMDTestCases[0].expected + lVar1 + -8);
    local_a8 = lVar1;
    testing::ScopedTrace::ScopedTrace
              (&local_f2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/ripemd/ripemd_test.cc"
               ,0x3d,(char *)puVar2);
    n = strlen((char *)puVar2);
    local_e0 = 0;
    do {
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                (&local_f1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/ripemd/ripemd_test.cc"
                 ,0x41,&local_e0);
      if (local_e0 == 0) {
        RIPEMD160(puVar2,n,(uchar *)local_c8);
      }
      else {
        RIPEMD160_Init((RIPEMD160_CTX *)local_98);
        if (n != 0) {
          uVar4 = 0;
          do {
            len = n - uVar4;
            if (local_e0 < n - uVar4) {
              len = local_e0;
            }
            RIPEMD160_Update((RIPEMD160_CTX *)local_98,puVar2 + uVar4,len);
            uVar4 = uVar4 + len;
          } while (uVar4 < n);
        }
        RIPEMD160_Final((uchar *)local_c8,(RIPEMD160_CTX *)local_98);
      }
      local_f0.span_.data_ = (uchar *)local_c8;
      local_f0.span_.size_ = 0x14;
      local_d8.span_.data_ = local_a0;
      local_d8.span_.size_ = 0x14;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_98,"Bytes(digest)","Bytes(test.expected)",&local_f0,&local_d8);
      if (local_98[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_f0);
        pcVar3 = "";
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = (local_90->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/ripemd/ripemd_test.cc"
                   ,0x58,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_f0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
        if ((internal *)local_f0.span_.data_ != (internal *)0x0) {
          (**(code **)(*(long *)local_f0.span_.data_ + 8))();
        }
      }
      if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_90,local_90);
      }
      testing::ScopedTrace::~ScopedTrace(&local_f1);
      local_e0 = local_e0 + 1;
    } while (local_e0 <= n);
    testing::ScopedTrace::~ScopedTrace(&local_f2);
    lVar1 = local_a8 + 0x20;
  } while (lVar1 != 0x100);
  puVar2 = (uchar *)operator_new__(1000000);
  memset(puVar2,0,1000000);
  memset(puVar2,0x61,1000000);
  RIPEMD160(puVar2,1000000,local_98);
  local_f0.span_.size_ = 0x14;
  local_d8.span_.data_ = TestBody::kMillionADigest;
  local_d8.span_.size_ = 0x14;
  local_f0.span_.data_ = local_98;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            (local_c8,"Bytes(digest)","Bytes(kMillionADigest)",&local_f0,&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_f0.span_.data_ + 0x10),
               "Digest incorrect for \"million a\'s\" test",0x27);
    if (local_c0[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_c0[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/ripemd/ripemd_test.cc"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
  }
  if (local_c0[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,local_c0[0]);
  }
  operator_delete__(puVar2);
  return;
}

Assistant:

TEST(RIPEMDTest, RunTest) {
  for (const auto &test : kRIPEMDTestCases) {
    SCOPED_TRACE(test.input);
    const size_t input_len = strlen(test.input);

    for (size_t stride = 0; stride <= input_len; stride++) {
      SCOPED_TRACE(stride);
      uint8_t digest[RIPEMD160_DIGEST_LENGTH];
      if (stride == 0) {
        RIPEMD160(reinterpret_cast<const uint8_t *>(test.input), input_len,
                  digest);
      } else {
        RIPEMD160_CTX ctx;
        RIPEMD160_Init(&ctx);

        for (size_t done = 0; done < input_len;) {
          const size_t remaining = input_len - done;
          size_t todo = stride;
          if (todo > remaining) {
            todo = remaining;
          }

          RIPEMD160_Update(&ctx, &test.input[done], todo);
          done += todo;
        }

        RIPEMD160_Final(digest, &ctx);
      }

      EXPECT_EQ(Bytes(digest), Bytes(test.expected));
    }
  }

  static const size_t kLargeBufSize = 1000000;
  auto buf = std::make_unique<uint8_t[]>(kLargeBufSize);
  OPENSSL_memset(buf.get(), 'a', kLargeBufSize);
  uint8_t digest[RIPEMD160_DIGEST_LENGTH];
  RIPEMD160(buf.get(), kLargeBufSize, digest);

  static const uint8_t kMillionADigest[RIPEMD160_DIGEST_LENGTH] = {
      0x52, 0x78, 0x32, 0x43, 0xc1, 0x69, 0x7b, 0xdb, 0xe1, 0x6d,
      0x37, 0xf9, 0x7f, 0x68, 0xf0, 0x83, 0x25, 0xdc, 0x15, 0x28};
  EXPECT_EQ(Bytes(digest), Bytes(kMillionADigest))
      << "Digest incorrect for \"million a's\" test";
}